

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_deviation(lysp_yang_ctx *ctx,lysp_deviation **deviations)

{
  long *plVar1;
  lysp_ext_instance **exts;
  long lVar2;
  size_t len;
  LY_ERR LVar3;
  long *plVar4;
  lysp_ext_instance **pplVar5;
  char *format;
  ly_stmt parent_stmt;
  lysp_ext_instance *plVar6;
  ly_ctx *plVar7;
  char *pcVar8;
  lysp_deviation *plVar9;
  bool bVar10;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysf_ctx fctx;
  lysp_ext_instance **in_stack_ffffffffffffff60;
  ly_stmt local_94;
  lysp_deviation **local_90;
  char *local_88;
  size_t local_80;
  lysp_ext_instance **local_78;
  lysp_ext_instance **local_70;
  lysp_ext_instance **local_68;
  char *local_60;
  lysf_ctx local_58;
  
  local_58.ext_set.size = 0;
  local_58.ext_set.count = 0;
  local_58.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_58.mod = (lys_module *)0x0;
  if (ctx == (lysp_yang_ctx *)0x0) {
    local_58.ctx = (ly_ctx *)0x0;
  }
  else {
    local_58.ctx = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  plVar9 = *deviations;
  if (plVar9 == (lysp_deviation *)0x0) {
    plVar4 = (long *)malloc(0x30);
    if (plVar4 == (long *)0x0) goto LAB_0017d185;
    *plVar4 = 1;
  }
  else {
    plVar6 = plVar9[-1].exts;
    plVar9[-1].exts = (lysp_ext_instance *)((long)&plVar6->name + 1);
    plVar4 = (long *)realloc(&plVar9[-1].exts,(long)plVar6 * 0x28 + 0x30);
    if (plVar4 == (long *)0x0) {
      (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
LAB_0017d185:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_deviation");
      return LY_EMEM;
    }
  }
  *deviations = (lysp_deviation *)(plVar4 + 1);
  lVar2 = *plVar4;
  plVar1 = plVar4 + lVar2 * 5;
  plVar9 = (lysp_deviation *)(plVar1 + -4);
  plVar1[-2] = 0;
  plVar1[-1] = 0;
  plVar9->nodeid = (char *)0x0;
  plVar1[-3] = 0;
  *plVar1 = 0;
  LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_88,&local_60,&local_80);
  len = local_80;
  if (LVar3 != LY_SUCCESS) goto LAB_0017d136;
  local_90 = deviations;
  if (local_80 == 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar7,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
           "deviation");
  }
  deviations = local_90;
  if (local_60 == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar8 = local_88;
    if (len == 0) {
      pcVar8 = "";
    }
    LVar3 = lydict_insert(plVar7,pcVar8,len,(char **)plVar9);
    deviations = local_90;
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = lydict_insert_zc(plVar7,local_88,(char **)plVar9);
  }
  if ((LVar3 != LY_SUCCESS) ||
     (LVar3 = get_keyword(ctx,&local_94,&local_88,&local_80), LVar3 != LY_SUCCESS))
  goto LAB_0017d136;
  if (local_94 == LY_STMT_SYNTAX_SEMICOLON) {
    bVar10 = true;
LAB_0017d314:
    exts = (lysp_ext_instance **)(plVar4 + lVar2 * 5);
    if (!bVar10) {
      local_68 = exts + -2;
      local_70 = exts + -1;
      local_78 = exts + -3;
      do {
        deviations = local_90;
        if ((int)local_94 < 0xf0000) {
          if (local_94 == LY_STMT_DESCRIPTION) {
            plVar6 = *local_78;
            parent_stmt = LY_STMT_DESCRIPTION;
            pplVar5 = local_78;
LAB_0017d40e:
            LVar3 = parse_text_field(ctx,plVar6,parent_stmt,(uint32_t)pplVar5,(char **)0x2,
                                     Y_IDENTIF_ARG,(uint16_t *)exts,in_stack_ffffffffffffff60);
          }
          else {
            if (local_94 != LY_STMT_DEVIATE) {
LAB_0017d4fc:
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar7 = (ly_ctx *)0x0;
              }
              else {
                plVar7 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar8 = lyplg_ext_stmt2str(local_94);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
              goto LAB_0017d4eb;
            }
            LVar3 = parse_deviate(ctx,(lysp_deviate **)local_70);
          }
        }
        else {
          if (local_94 != LY_STMT_EXTENSION_INSTANCE) {
            if (local_94 != LY_STMT_REFERENCE) goto LAB_0017d4fc;
            plVar6 = *local_68;
            parent_stmt = LY_STMT_REFERENCE;
            pplVar5 = local_68;
            goto LAB_0017d40e;
          }
          LVar3 = parse_ext(ctx,local_88,local_80,plVar9,LY_STMT_DEVIATION,0,exts);
        }
        deviations = local_90;
        if ((LVar3 != LY_SUCCESS) ||
           (LVar3 = get_keyword(ctx,&local_94,&local_88,&local_80), deviations = local_90,
           LVar3 != LY_SUCCESS)) goto LAB_0017d136;
        if (local_94 == LY_STMT_SYNTAX_RIGHT_BRACE) {
          bVar10 = true;
          if ((*exts != (lysp_ext_instance *)0x0) &&
             (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
             deviations = local_90, LVar3 != LY_SUCCESS)) goto LAB_0017d136;
        }
      } while (!bVar10);
    }
    LVar3 = LY_SUCCESS;
    deviations = local_90;
    if (exts[-1] != (lysp_ext_instance *)0x0) goto LAB_0017d136;
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
    pcVar8 = "deviate";
LAB_0017d4eb:
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar8,"deviation");
  }
  else {
    if (local_94 == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar3 = get_keyword(ctx,&local_94,&local_88,&local_80);
      if (LVar3 != LY_SUCCESS) goto LAB_0017d136;
      bVar10 = local_94 == LY_STMT_SYNTAX_RIGHT_BRACE;
      goto LAB_0017d314;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar8 = lyplg_ext_stmt2str(local_94);
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\".",
            pcVar8);
  }
  LVar3 = LY_EVALID;
LAB_0017d136:
  if (LVar3 == LY_SUCCESS) {
    return LY_SUCCESS;
  }
  lysp_deviation_free(&local_58,plVar9);
  plVar9 = *deviations;
  plVar6 = (lysp_ext_instance *)((long)&plVar9[-1].exts[-1].exts + 7);
  plVar9[-1].exts = plVar6;
  if (plVar6 != (lysp_ext_instance *)0x0 && plVar9 != (lysp_deviation *)0x0) {
    return LVar3;
  }
  if (plVar9 != (lysp_deviation *)0x0) {
    free(&plVar9[-1].exts);
  }
  *deviations = (lysp_deviation *)0x0;
  return LVar3;
}

Assistant:

LY_ERR
parse_deviation(struct lysp_yang_ctx *ctx, struct lysp_deviation **deviations)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_deviation *dev;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(ctx)};

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *deviations, dev, LY_EMEM);

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);
    CHECK_NONEMPTY(ctx, word_len, "deviation");
    INSERT_WORD_GOTO(ctx, buf, dev->nodeid, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            ret = parse_text_field(ctx, dev->dsc, LY_STMT_DESCRIPTION, 0, &dev->dsc, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_DEVIATE:
            LY_CHECK_GOTO(ret = parse_deviate(ctx, &dev->deviates), cleanup);
            break;
        case LY_STMT_REFERENCE:
            ret = parse_text_field(ctx, dev->ref, LY_STMT_REFERENCE, 0, &dev->ref, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, dev, LY_STMT_DEVIATION, 0, &dev->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "deviation");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, dev->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!dev->deviates) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "deviate", "deviation");
        ret = LY_EVALID;
        goto cleanup;
    }

cleanup:
    if (ret) {
        lysp_deviation_free(&fctx, dev);
        LY_ARRAY_DECREMENT_FREE(*deviations);
    }
    return ret;
}